

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockDocumentationTest.cpp
# Opt level: O2

void __thiscall
TEST_MockDocumentation_setData_Test::TEST_MockDocumentation_setData_Test
          (TEST_MockDocumentation_setData_Test *this)

{
  (this->super_TEST_GROUP_CppUTestGroupMockDocumentation).super_Utest._vptr_Utest =
       (_func_int **)0x0;
  TEST_GROUP_CppUTestGroupMockDocumentation::TEST_GROUP_CppUTestGroupMockDocumentation
            (&this->super_TEST_GROUP_CppUTestGroupMockDocumentation);
  (this->super_TEST_GROUP_CppUTestGroupMockDocumentation).super_Utest._vptr_Utest =
       (_func_int **)&PTR__Utest_001635c0;
  return;
}

Assistant:

TEST(MockDocumentation, setData)
{
    ClassFromProductionCode object;
    mock().setData("importantValue", 10);
    mock().setDataObject("importantObject", "ClassFromProductionCode", &object);

    ClassFromProductionCode* pobject;
    int value = mock().getData("importantValue").getIntValue();
    pobject = (ClassFromProductionCode*)mock().getData("importantObject").getObjectPointer();

    LONGS_EQUAL(10, value);
    POINTERS_EQUAL(pobject, &object);
}